

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O0

float_type get_time_step_fdtd(fdtd *fdtd)

{
  int iVar1;
  int *in_RDI;
  float_type local_8;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    local_8 = *(float_type *)(in_RDI + 4);
  }
  else if (iVar1 == 1) {
    local_8 = *(float_type *)(in_RDI + 6);
  }
  else {
    if (iVar1 != 2) {
      fprintf(_stderr,"get_time_step: unknown fdtd type\n");
      exit(1);
    }
    local_8 = *(float_type *)(in_RDI + 8);
  }
  return local_8;
}

Assistant:

inline float_type get_time_step_fdtd(const struct fdtd *fdtd) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    return fdtd->oneDim.dt;
  case fdtd_two_dims:
    return fdtd->twoDims.dt;
  case fdtd_three_dims:
    return fdtd->threeDims.dt;
  default:
    fprintf(stderr, "get_time_step: unknown fdtd type\n");
    exit(EXIT_FAILURE);
  }
}